

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O3

void __thiscall
MT32Emu::LA32FloatWaveGenerator::initSynth
          (LA32FloatWaveGenerator *this,bool useSawtoothWaveform,Bit8u usePulseWidth,
          Bit8u useResonance)

{
  this->sawtoothWaveform = useSawtoothWaveform;
  this->pulseWidth = usePulseWidth;
  this->resonance = useResonance;
  this->wavePos = 0.0;
  this->lastFreq = 0.0;
  this->pcmWaveAddress = (Bit16s *)0x0;
  this->active = true;
  return;
}

Assistant:

void LA32FloatWaveGenerator::initSynth(const bool useSawtoothWaveform, const Bit8u usePulseWidth, const Bit8u useResonance) {
	sawtoothWaveform = useSawtoothWaveform;
	pulseWidth = usePulseWidth;
	resonance = useResonance;

	wavePos = 0.0f;
	lastFreq = 0.0f;

	pcmWaveAddress = NULL;
	active = true;
}